

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O0

void __thiscall FileReceiveSession::on_input(FileReceiveSession *this,Poll *p)

{
  bool bVar1;
  ssize_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  path local_90;
  path local_70;
  path local_40;
  int local_1c;
  Poll *pPStack_18;
  int bytes;
  Poll *p_local;
  FileReceiveSession *this_local;
  
  pPStack_18 = p;
  p_local = (Poll *)this;
  sVar2 = read((this->super_Subscriber).fd,FILE_REC_BUF,10000);
  local_1c = (int)sVar2;
  if (local_1c < 0) {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->fail);
    if (bVar1) {
      boost::filesystem::path::path(&local_40,&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->fail,&local_40);
      boost::filesystem::path::~path(&local_40);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Error in reading from socket ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Poll::unsubscribe(pPStack_18,&this->super_Subscriber);
  }
  else if (local_1c < 1) {
    std::fstream::close();
    bVar1 = std::function::operator_cast_to_bool((function *)&this->success);
    if (bVar1) {
      boost::filesystem::path::path(&local_90,&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->success,&local_90);
      boost::filesystem::path::~path(&local_90);
    }
    Poll::unsubscribe(pPStack_18,&this->super_Subscriber);
  }
  else {
    std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                         field_0x10,0x13fb80);
    uVar4 = std::ios::operator!((ios *)(&(this->stream).
                                         super_basic_fstream<char,_std::char_traits<char>_>.
                                         field_0x0 +
                                       *(long *)(*(long *)&(this->stream).
                                                                                                                      
                                                  super_basic_fstream<char,_std::char_traits<char>_>
                                                + -0x18)));
    if ((uVar4 & 1) != 0) {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->fail);
      if (bVar1) {
        boost::filesystem::path::path(&local_70,&this->file);
        std::function<void_(boost::filesystem::path)>::operator()(&this->fail,&local_70);
        boost::filesystem::path::~path(&local_70);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Could not write to file ");
      poVar3 = (ostream *)
               boost::filesystem::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,&this->file);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Poll::unsubscribe(pPStack_18,&this->super_Subscriber);
    }
  }
  return;
}

Assistant:

void FileReceiveSession::on_input(Poll &p) {
  int bytes = read(fd, FILE_REC_BUF, FILE_REC_BUF_SIZE);
  if (bytes < 0) {
    if (this->fail)
      this->fail(file);
    std::cout << "Error in reading from socket " << std::endl;
    p.unsubscribe(*this);
    return;
  } else if (bytes > 0) {
    stream.write(FILE_REC_BUF, bytes);
    if (!stream) {
      if (this->fail)
        this->fail(file);
      std::cout << "Could not write to file " << file << std::endl;
      p.unsubscribe(*this);
    }
  } else {
    stream.close();
    if (this->success)
      success(file);
    p.unsubscribe(*this);
  }
}